

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthread.cpp
# Opt level: O0

void __thiscall QThreadPrivate::QThreadPrivate(QThreadPrivate *this,QThreadData *d)

{
  Data *pDVar1;
  Data *in_RSI;
  QThreadData *in_RDI;
  QtPrivate_6_10_0 in_stack_ffffffffffffffac;
  QObjectPrivate *in_stack_ffffffffffffffb0;
  int initialRefCount;
  
  QObjectPrivate::QObjectPrivate(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  (in_RDI->eventLoops).super_QList<QEventLoop_*>.d.d = (Data *)&PTR__QThreadPrivate_00be8620;
  QMutex::QMutex((QMutex *)0x556663);
  QAtomicInt::QAtomicInt((QAtomicInt *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  *(undefined1 *)&in_RDI->loopLevel = 0;
  *(undefined1 *)((long)&in_RDI->loopLevel + 1) = 0;
  std::atomic<bool>::atomic
            ((atomic<bool> *)in_stack_ffffffffffffffb0,SUB41(in_stack_ffffffffffffffac >> 0x18,0));
  *(undefined1 *)((long)&in_RDI->loopLevel + 3) = 0;
  in_RDI->scopeLevel = 0;
  in_RDI->quitNow = true;
  in_RDI->canWait = true;
  in_RDI->isAdopted = true;
  in_RDI->requiresCoreApplication = true;
  *(undefined4 *)&in_RDI[1].eventLoops.super_QList<QEventLoop_*>.d.d = 0;
  *(undefined4 *)((long)&in_RDI[1].eventLoops.super_QList<QEventLoop_*>.d.d + 4) = 7;
  *(undefined4 *)&in_RDI[1].eventLoops.super_QList<QEventLoop_*>.d.ptr = 0;
  initialRefCount = (int)((ulong)&in_RDI[1].eventLoops.super_QList<QEventLoop_*>.d.size >> 0x20);
  QWaitCondition::QWaitCondition((QWaitCondition *)in_stack_ffffffffffffffb0);
  in_RDI[1].postEventList.super_QList<QPostEvent>.d.d = in_RSI;
  QtPrivate::BindingStatusOrList::BindingStatusOrList((BindingStatusOrList *)0x55670a);
  QString::QString((QString *)0x556720);
  if (in_RDI[1].postEventList.super_QList<QPostEvent>.d.d == (Data *)0x0) {
    pDVar1 = (Data *)operator_new(0x90);
    QThreadData::QThreadData(in_RDI,initialRefCount);
    in_RDI[1].postEventList.super_QList<QPostEvent>.d.d = pDVar1;
  }
  return;
}

Assistant:

QThreadPrivate::QThreadPrivate(QThreadData *d)
    : QObjectPrivate(), data(d)
{

// INTEGRITY doesn't support self-extending stack. The default stack size for
// a pthread on INTEGRITY is too small so we have to increase the default size
// to 128K.
#ifdef Q_OS_INTEGRITY
    stackSize = 128 * 1024;
#elif defined(Q_OS_RTEMS)
    Q_CONSTINIT static bool envStackSizeOk = false;
    static const int envStackSize = qEnvironmentVariableIntValue("QT_DEFAULT_THREAD_STACK_SIZE", &envStackSizeOk);
    if (envStackSizeOk)
        stackSize = envStackSize;
#endif

#if defined (Q_OS_WIN)
    handle = 0;
    terminationEnabled = true;
    terminatePending = false;
#endif

    if (!data)
        data = new QThreadData;
}